

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O3

uint qcc_arena_add_object(qcc_arena *arena,void *ptr,qcc_destroy_fn dtor)

{
  qcc_arena_object *pqVar1;
  bool bVar2;
  
  pqVar1 = arena->objects;
  bVar2 = 0xf < (ulong)((long)pqVar1 - (long)arena->free_memory);
  if (bVar2) {
    arena->objects = pqVar1 + -1;
    pqVar1[-1].ptr = ptr;
    pqVar1[-1].dtor = dtor;
  }
  return (uint)bVar2;
}

Assistant:

unsigned qcc_arena_add_object(struct qcc_arena *arena, void *ptr,
                              qcc_destroy_fn dtor)
{
    if (qcc_arena_memory_available(arena) < sizeof(struct qcc_arena_object))
        return 0;

    --arena->objects;
    arena->objects->ptr = ptr;
    arena->objects->dtor = dtor;
    return 1;
}